

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O1

void __thiscall
mapbox::detail::Earcut<unsigned_int>::splitEarcut(Earcut<unsigned_int> *this,Node *start)

{
  bool bVar1;
  Node *pNVar2;
  Node *a;
  bool bVar3;
  
  a = start;
  do {
    for (pNVar2 = a->next->next; bVar3 = pNVar2 != a->prev, bVar3; pNVar2 = pNVar2->next) {
      if (a->i != pNVar2->i) {
        bVar1 = isValidDiagonal(this,a,pNVar2);
        if (bVar1) {
          pNVar2 = splitPolygon(this,a,pNVar2);
          a = filterPoints(this,a,a->next);
          pNVar2 = filterPoints(this,pNVar2,pNVar2->next);
          earcutLinked(this,a,0);
          earcutLinked(this,pNVar2,0);
          goto LAB_003b3aa5;
        }
      }
    }
    a = a->next;
LAB_003b3aa5:
    if ((bVar3) || (a == start)) {
      return;
    }
  } while( true );
}

Assistant:

void Earcut<N>::splitEarcut(Node* start) {
    // look for a valid diagonal that divides the polygon into two
    Node* a = start;
    do {
        Node* b = a->next->next;
        while (b != a->prev) {
            if (a->i != b->i && isValidDiagonal(a, b)) {
                // split the polygon in two by the diagonal
                Node* c = splitPolygon(a, b);

                // filter colinear points around the cuts
                a = filterPoints(a, a->next);
                c = filterPoints(c, c->next);

                // run earcut on each half
                earcutLinked(a);
                earcutLinked(c);
                return;
            }
            b = b->next;
        }
        a = a->next;
    } while (a != start);
}